

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O0

void fiowrtobj(void *ctx0,toksdef *t)

{
  ushort uVar1;
  undefined8 *puVar2;
  FILE *__stream;
  uint i;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  unsigned_long l;
  size_t sVar7;
  uchar *__ptr;
  errcxdef *ctx_00;
  byte *in_RSI;
  long *in_RDI;
  int e;
  ulong startpos;
  int err;
  uint used;
  uint siz;
  uchar *p;
  uint flags;
  osfildef *fp;
  errcxdef *ec;
  mcmcxdef *mctx;
  mcmon obj;
  uchar buf [89];
  fiowcxdef *ctx;
  undefined6 in_stack_ffffffffffffff28;
  mcmon in_stack_ffffffffffffff2e;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff48;
  int iVar8;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uchar *local_a8;
  undefined4 in_stack_ffffffffffffff88;
  int for_debug;
  undefined1 uStack_74;
  undefined1 uStack_73;
  objnum in_stack_ffffffffffffff8e;
  mcmcxdef *in_stack_ffffffffffffff90;
  
  puVar2 = (undefined8 *)*in_RDI;
  __stream = (FILE *)in_RDI[2];
  uVar6 = *(uint *)(in_RDI + 3);
  iVar8 = 0;
  l = ftell(__stream);
  for_debug = CONCAT31((int3)((uint)in_stack_ffffffffffffff88 >> 8),*in_RSI);
  uVar1 = *(ushort *)(in_RSI + 2);
  oswp2(&stack0xffffffffffffff89,(uint)uVar1);
  ctx_00 = (errcxdef *)(ulong)(*in_RSI - 1);
  switch(ctx_00) {
  case (errcxdef *)0x0:
    local_a8 = mcmlck((mcmcxdef *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
    uVar3 = (uint)*(ushort *)
                   (*(long *)(*(long *)*puVar2 +
                             (long)((int)(uint)*(ushort *)
                                                (puVar2[(long)((int)(uint)uVar1 >> 8) + 6] +
                                                (long)(int)(uVar1 & 0xff) * 2) >> 8) * 8) +
                    (long)(int)(*(ushort *)
                                 (puVar2[(long)((int)(uint)uVar1 >> 8) + 6] +
                                 (long)(int)(uVar1 & 0xff) * 2) & 0xff) * 0x20 + 0x18);
    i = uVar3;
    goto LAB_001236cd;
  case (errcxdef *)0x1:
    objcomp(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,for_debug);
    local_a8 = mcmlck((mcmcxdef *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (mcmon)((ulong)ctx_00 >> 0x30));
    i = (uint)*(ushort *)
               (*(long *)(*(long *)*puVar2 +
                         (long)((int)(uint)*(ushort *)
                                            (puVar2[(long)((int)(uint)uVar1 >> 8) + 6] +
                                            (long)(int)(uVar1 & 0xff) * 2) >> 8) * 8) +
                (long)(int)(*(ushort *)
                             (puVar2[(long)((int)(uint)uVar1 >> 8) + 6] +
                             (long)(int)(uVar1 & 0xff) * 2) & 0xff) * 0x20 + 0x18);
    uVar3 = osrp2(local_a8 + 8);
    uVar3 = uVar3 & 0xffff;
    uVar4 = osrp2(local_a8 + 2);
    if ((uVar4 & 2) != 0) {
      uVar4 = osrp2(local_a8 + 6);
      uVar3 = (uVar4 & 0xffff) * 4 + uVar3;
    }
LAB_001236cd:
    oswp2(&stack0xffffffffffffff8b,i);
    oswp2(&uStack_73,uVar3);
    sVar7 = fwrite(&stack0xffffffffffffff88,7,1,__stream);
    if (sVar7 != 1) {
      iVar8 = 0x259;
    }
    if ((uVar6 & 8) != 0) {
      fioxor(local_a8,uVar3,*(uint *)(in_RDI + 5),*(uint *)((long)in_RDI + 0x2c));
    }
    sVar7 = fwrite(local_a8,(ulong)uVar3,1,__stream);
    if (sVar7 != 1) {
      iVar8 = 0x259;
    }
    if (in_RDI[4] != 0) {
      oswp4(&stack0xffffffffffffff8f,l);
      sVar7 = fwrite(&stack0xffffffffffffff88,0xb,1,(FILE *)in_RDI[4]);
      if (sVar7 != 1) {
        iVar8 = 0x259;
      }
    }
    mcmunlck((mcmcxdef *)ctx_00,in_stack_ffffffffffffff2e);
    mcmfre((mcmcxdef *)ctx_00,in_stack_ffffffffffffff2e);
    break;
  case (errcxdef *)0x6:
  case (errcxdef *)0x7:
    uVar5 = 0x25c;
    if (*in_RSI == 8) {
      uVar5 = 0x25b;
    }
    if ((uVar6 & 0x10) == 0) {
      sup_log_undefobj((mcmcxdef *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (errcxdef *)CONCAT44(iVar8,in_stack_ffffffffffffff48),(int)(l >> 0x20),
                       (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),0,
                       (objnum)(*in_RSI - 1 >> 0x10));
      *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) + 1;
      mcmfre((mcmcxdef *)ctx_00,in_stack_ffffffffffffff2e);
    }
    else {
      __ptr = mcmlck((mcmcxdef *)CONCAT44(uVar5,in_stack_ffffffffffffff38),0);
      uVar6 = (uint)*(ushort *)
                     (*(long *)(*(long *)*puVar2 +
                               (long)((int)(uint)*(ushort *)
                                                  (puVar2[(long)((int)(uint)uVar1 >> 8) + 6] +
                                                  (long)(int)(uVar1 & 0xff) * 2) >> 8) * 8) +
                      (long)(int)(*(ushort *)
                                   (puVar2[(long)((int)(uint)uVar1 >> 8) + 6] +
                                   (long)(int)(uVar1 & 0xff) * 2) & 0xff) * 0x20 + 0x18);
      oswp2(&stack0xffffffffffffff8b,uVar6);
      sVar7 = fwrite(&stack0xffffffffffffff88,5,1,__stream);
      if ((sVar7 != 1) || (sVar7 = fwrite(__ptr,(ulong)uVar6,1,__stream), sVar7 != 1)) {
        iVar8 = 0x259;
      }
    }
    break;
  case (errcxdef *)0x9:
    memcpy(&uStack_74,in_RSI + 7,(ulong)in_RSI[6]);
    sVar7 = fwrite(&stack0xffffffffffffff88,(long)(int)(in_RSI[6] + 4),1,__stream);
    if (sVar7 != 1) {
      iVar8 = 0x259;
    }
    if ((in_RDI[4] != 0) &&
       (sVar7 = fwrite(&stack0xffffffffffffff88,(long)(int)(in_RSI[6] + 4),1,(FILE *)in_RDI[4]),
       sVar7 != 1)) {
      iVar8 = 0x259;
    }
  }
  if (iVar8 != 0) {
    errsigf(ctx_00,(char *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  }
  return;
}

Assistant:

static void fiowrtobj(void *ctx0, toksdef *t)
{
    fiowcxdef *ctx = (fiowcxdef *)ctx0;
    uchar      buf[TOKNAMMAX + 50];
    mcmon      obj;
    mcmcxdef  *mctx = ctx->fiowcxmem;
    errcxdef  *ec = ctx->fiowcxerr;
    osfildef  *fp = ctx->fiowcxfp;
    uint       flags = ctx->fiowcxflg;
    uchar     *p;
    uint       siz;
    uint       used;
    int        err = 0;
    ulong      startpos = osfpos(fp);
    
    /* set up start of buffer to write */
    buf[0] = t->tokstyp;
    obj = t->toksval;
    oswp2(buf + 1, obj);
    
    switch(t->tokstyp)
    {
    case TOKSTOBJ:
        /* 
         *   Mark object as finished with compilation.  Note that we must
         *   do this even though tcdmain() does this as well, because
         *   running preinit() might have updated properties since the
         *   last time we marked objects.  
         */
        objcomp(mctx, (objnum)obj, ctx->fiowcxdebug);

        /* get the object's size information */
        p = mcmlck(mctx, (mcmon)obj);
        siz = mcmobjsiz(mctx, (mcmon)obj);         /* size in cache */
        used = objfree(p);          /* size actually used in object */
        if (objflg(p) & OBJFINDEX) used += objnprop(p) * 4;
        goto write_func_or_obj;
                
    case TOKSTFUNC:
        /* size of function is entire object */
        p = mcmlck(mctx, (mcmon)obj);
        siz = used = mcmobjsiz(mctx, (mcmon)obj);

    write_func_or_obj:
        /* write type(OBJ) + objnum + size + sizeused */
        oswp2(buf+3, siz);
        oswp2(buf+5, used);
        if (osfwb(fp, buf, 7)) err = ERR_WRTGAM;
                
        /* write contents of object */
        if (flags & FIOFCRYPT)
            fioxor(p, used, ctx->fiowcxseed, ctx->fiowcxinc);
        if (osfwb(fp, p, used)) err = ERR_WRTGAM;
        
        /* write fast-load record if applicable */
        if (ctx->fiowcxffp)
        {
            oswp4(buf + 7, startpos);
            if (osfwb(ctx->fiowcxffp, buf, 11)) err = ERR_WRTGAM;
        }
                
        /*
         *   We're done with the object - delete it so that
         *   it doesn't have to be swapped out (which would
         *   be pointless, since we'll never need it again).
         */
        mcmunlck(mctx, (mcmon)obj);
        mcmfre(mctx, (mcmon)obj);
        break;
                
    case TOKSTEXTERN:
        /* all we must write is the name & number of ext func */
        buf[3] = t->tokslen;
        memcpy(buf + 4, t->toksnam, (size_t)t->tokslen);
        if (osfwb(fp, buf, t->tokslen + 4)) err = ERR_WRTGAM;
        
        /* write fast-load record if applicable */
        if (ctx->fiowcxffp
            && osfwb(ctx->fiowcxffp, buf, t->tokslen + 4)) err = ERR_WRTGAM;
        break;
                
    case TOKSTFWDOBJ:
    case TOKSTFWDFN:
        {
            int  e = (t->tokstyp == TOKSTFWDFN ? ERR_UNDEFF : ERR_UNDEFO);

            if (flags & FIOFBIN)
            {
                /* write record for the forward reference */
                p = mcmlck(mctx, (mcmon)obj);
                siz = mcmobjsiz(mctx, (mcmon)obj);
                oswp2(buf+3, siz);
                if (osfwb(fp, buf, 5)
                    || osfwb(fp, p, siz))
                    err = ERR_WRTGAM;
            }
            else
            {
                /* log the undefined-object error */
                sup_log_undefobj(mctx, ec, e,
                                 t->toksnam, (int)t->tokslen, obj);

                /* count the undefined object */
                ++(ctx->fiowcxund);

                /*
                 *   we don't need this object any longer - delete it so
                 *   that we don't have to bother swapping it in or out
                 */
                mcmfre(mctx, (mcmon)obj);
            }
        }
        break;
    }
                    
    /* if an error occurred, signal it */
    if (err) errsig(ec, err);
}